

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

bool __thiscall kernel::BlockTreeDB::ReadFlag(BlockTreeDB *this,string *name,bool *fValue)

{
  long lVar1;
  bool bVar2;
  undefined8 in_RDX;
  uchar *in_RDI;
  long in_FS_OFFSET;
  uint8_t ch;
  pair<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff78;
  uchar *in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffce;
  char in_stack_ffffffffffffffcf;
  CDBWrapper *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_pair<unsigned_char_const&,std::__cxx11::string_const&>
            (in_stack_ffffffffffffff80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff78);
  bVar2 = ::CDBWrapper::Read<std::pair<unsigned_char,std::__cxx11::string>,unsigned_char>
                    (in_stack_ffffffffffffffd0,
                     (pair<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_ffffffffffffffcf,
                                 CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)),
                     in_RDI);
  std::
  pair<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(in_stack_ffffffffffffff78);
  bVar2 = ((bVar2 ^ 0xffU) & 1) == 0;
  if (bVar2) {
    *(bool *)in_RDX = in_stack_ffffffffffffffcf == '1';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool BlockTreeDB::ReadFlag(const std::string& name, bool& fValue)
{
    uint8_t ch;
    if (!Read(std::make_pair(DB_FLAG, name), ch)) {
        return false;
    }
    fValue = ch == uint8_t{'1'};
    return true;
}